

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cpp
# Opt level: O1

void __thiscall Array::Array(Array *this,string *name,attr *a)

{
  _Elt_pointer piVar1;
  _Map_pointer ppiVar2;
  _Map_pointer ppiVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  int *piVar10;
  int *piVar11;
  int local_2c;
  
  (this->directSize).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_last = (_Elt_pointer)0x0;
  (this->directSize).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_node = (_Map_pointer)0x0;
  (this->directSize).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_cur = (_Elt_pointer)0x0;
  (this->directSize).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_first = (_Elt_pointer)0x0;
  (this->directSize).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_start._M_last = (_Elt_pointer)0x0;
  (this->directSize).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_start._M_node = (_Map_pointer)0x0;
  (this->directSize).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_start._M_cur = (_Elt_pointer)0x0;
  (this->directSize).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_start._M_first = (_Elt_pointer)0x0;
  (this->directSize).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_map = (_Map_pointer)0x0;
  (this->directSize).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_map_size = 0;
  std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map
            ((_Deque_base<int,_std::allocator<int>_> *)this,0);
  (this->newName)._M_dataplus._M_p = (pointer)&(this->newName).field_2;
  (this->newName)._M_string_length = 0;
  (this->newName).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&this->newName);
  for (; a->kind == 1; a = ((a->field_1).array)->type) {
    piVar10 = &((a->field_1).basic)->type;
    piVar1 = (this->directSize).super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur;
    if (piVar1 == (this->directSize).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                  super__Deque_impl_data._M_start._M_first) {
      std::deque<int,std::allocator<int>>::_M_push_front_aux<int_const&>
                ((deque<int,std::allocator<int>> *)this,piVar10);
    }
    else {
      piVar1[-1] = *piVar10;
      (this->directSize).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data
      ._M_start._M_cur = piVar1 + -1;
    }
  }
  if (a->kind == 0) {
    local_2c = 4;
    piVar1 = (this->directSize).super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur;
    if (piVar1 == (this->directSize).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                  super__Deque_impl_data._M_start._M_first) {
      std::deque<int,_std::allocator<int>_>::_M_push_front_aux<int>(&this->directSize,&local_2c);
    }
    else {
      piVar1[-1] = 4;
      (this->directSize).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data
      ._M_start._M_cur = piVar1 + -1;
    }
    ppiVar2 = (this->directSize).super__Deque_base<int,_std::allocator<int>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node;
    ppiVar3 = (this->directSize).super__Deque_base<int,_std::allocator<int>_>._M_impl.
              super__Deque_impl_data._M_start._M_node;
    piVar1 = (this->directSize).super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur;
    uVar4 = (int)((ulong)((long)(this->directSize).super__Deque_base<int,_std::allocator<int>_>.
                                _M_impl.super__Deque_impl_data._M_start._M_last - (long)piVar1) >> 2
                 ) + (int)((ulong)((long)(this->directSize).
                                         super__Deque_base<int,_std::allocator<int>_>._M_impl.
                                         super__Deque_impl_data._M_finish._M_cur -
                                  (long)(this->directSize).
                                        super__Deque_base<int,_std::allocator<int>_>._M_impl.
                                        super__Deque_impl_data._M_finish._M_first) >> 2) +
            ((int)((ulong)((long)ppiVar2 - (long)ppiVar3) >> 3) + -1 +
            (uint)(ppiVar2 == (_Map_pointer)0x0)) * 0x80;
    if (1 < (int)uVar4) {
      lVar7 = (long)piVar1 -
              (long)(this->directSize).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                    super__Deque_impl_data._M_start._M_first;
      uVar8 = lVar7 >> 2;
      lVar5 = (ulong)(uVar4 & 0x7fffffff) - 1;
      lVar9 = 1;
      do {
        if (uVar8 < 0x80) {
          piVar10 = piVar1 + lVar9 + -1;
        }
        else {
          uVar6 = uVar8 >> 7 | 0xfe00000000000000;
          if (0 < (long)uVar8) {
            uVar6 = uVar8 >> 7;
          }
          piVar10 = (int *)((long)ppiVar3[uVar6] + lVar7 + uVar6 * -0x200);
        }
        uVar8 = uVar8 + 1;
        if (uVar8 < 0x80) {
          piVar11 = piVar1 + lVar9;
        }
        else {
          uVar6 = uVar8 >> 7 | 0xfe00000000000000;
          if (0 < (long)uVar8) {
            uVar6 = uVar8 >> 7;
          }
          piVar11 = (int *)((long)ppiVar3[uVar6] + lVar7 + uVar6 * -0x200 + 4);
        }
        *piVar11 = *piVar10 * *piVar11;
        lVar9 = lVar9 + 1;
        lVar7 = lVar7 + 4;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
    }
    return;
  }
  std::operator<<((ostream *)&std::cerr,"Structure not implemented!\n");
  exit(1);
}

Assistant:

Array(const string &name, attr *a) {
        newName = name;
        while (a->kind == ARRAY) {
            directSize.push_front(a->array->size);
            a = a->array->type;
        }
        if (a->kind == BASIC) directSize.push_front(4);
        else { /* TODO Struct */
            IMP_ME("Structure");
        }
        for (int i = 1; i < (int)directSize.size(); ++i)
            directSize[i] *= directSize[i - 1];
    }